

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_QPDFTokenizer.cc
# Opt level: O2

void __thiscall
Pl_QPDFTokenizer::Pl_QPDFTokenizer
          (Pl_QPDFTokenizer *this,char *identifier,TokenFilter *filter,Pipeline *next)

{
  unique_ptr<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_> *puVar1;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_QPDFTokenizer_002ac690;
  puVar1 = &this->m;
  std::make_unique<Pl_QPDFTokenizer::Members>();
  ((puVar1->_M_t).
   super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
   ._M_t.
   super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
   .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->filter = filter;
  QPDFObjectHandle::TokenFilter::setPipeline
            (((puVar1->_M_t).
              super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
              ._M_t.
              super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
              .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->filter,next)
  ;
  QPDFTokenizer::allowEOF
            (&((puVar1->_M_t).
               super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
               ._M_t.
               super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
               .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->tokenizer);
  QPDFTokenizer::includeIgnorable
            (&((puVar1->_M_t).
               super___uniq_ptr_impl<Pl_QPDFTokenizer::Members,_std::default_delete<Pl_QPDFTokenizer::Members>_>
               ._M_t.
               super__Tuple_impl<0UL,_Pl_QPDFTokenizer::Members_*,_std::default_delete<Pl_QPDFTokenizer::Members>_>
               .super__Head_base<0UL,_Pl_QPDFTokenizer::Members_*,_false>._M_head_impl)->tokenizer);
  return;
}

Assistant:

Pl_QPDFTokenizer::Pl_QPDFTokenizer(
    char const* identifier, QPDFObjectHandle::TokenFilter* filter, Pipeline* next) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>())
{
    m->filter = filter;
    QPDFObjectHandle::TokenFilter::PipelineAccessor::setPipeline(m->filter, next);
    m->tokenizer.allowEOF();
    m->tokenizer.includeIgnorable();
}